

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O2

bool __thiscall fmcalc::loadcoverages(fmcalc *this,vector<float,_std::allocator<float>_> *coverages)

{
  FILE *__stream;
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  string file;
  OASIS_FLOAT tiv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&file,"input/coverages.bin",(allocator *)&tiv);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tiv,
                   &this->inputpath_,&local_50);
    std::__cxx11::string::operator=((string *)&file,(string *)&tiv);
    std::__cxx11::string::~string((string *)&tiv);
    std::__cxx11::string::~string((string *)&local_50);
  }
  __stream = fopen(file._M_dataplus._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    std::vector<float,_std::allocator<float>_>::resize(coverages,(uVar1 >> 2) + 1);
    lVar3 = 4;
    while( true ) {
      sVar2 = fread(&tiv,4,1,__stream);
      if (sVar2 == 0) break;
      *(OASIS_FLOAT *)
       ((long)(coverages->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start + lVar3) = tiv;
      lVar3 = lVar3 + 4;
    }
    fclose(__stream);
  }
  std::__cxx11::string::~string((string *)&file);
  return __stream != (FILE *)0x0;
}

Assistant:

bool fmcalc::loadcoverages(std::vector<OASIS_FLOAT> &coverages)
{

	FILE *fin = NULL;
	std::string file = COVERAGES_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) return false;

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);

	OASIS_FLOAT tiv;
	size_t nrec = sz / sizeof(tiv);

	coverages.resize(nrec + 1);
	int coverage_id = 0;
	size_t i = fread(&tiv, sizeof(tiv), 1, fin);
	while (i != 0) {
		coverage_id++;
		coverages[coverage_id] = tiv;
		i = fread(&tiv, sizeof(tiv), 1, fin);
	}

	fclose(fin);
	return true;

}